

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.h
# Opt level: O0

void ut::is_false(bool value,LocationInfo *location)

{
  FailedAssertion *this;
  allocator local_39;
  string local_38;
  LocationInfo *local_18;
  LocationInfo *location_local;
  bool value_local;
  
  if (value) {
    local_18 = location;
    location_local._7_1_ = value;
    this = (FailedAssertion *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"Value is not \'false\'!",&local_39);
    FailedAssertion::FailedAssertion(this,&local_38,local_18);
    __cxa_throw(this,&FailedAssertion::typeinfo,FailedAssertion::~FailedAssertion);
  }
  return;
}

Assistant:

inline void is_false(bool value, const LocationInfo &location)
	{
		if (value)
			throw FailedAssertion("Value is not 'false'!", location);
	}